

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

uint64_t llvm::hashing::detail::hash_short(char *s,size_t length,uint64_t seed)

{
  uint64_t seed_local;
  size_t length_local;
  char *s_local;
  
  if ((length < 4) || (8 < length)) {
    if ((length < 9) || (0x10 < length)) {
      if ((length < 0x11) || (0x20 < length)) {
        if (length < 0x21) {
          if (length == 0) {
            s_local = (char *)(seed ^ 0x9ae16a3b2f90404f);
          }
          else {
            s_local = (char *)hash_1to3_bytes(s,length,seed);
          }
        }
        else {
          s_local = (char *)hash_33to64_bytes(s,length,seed);
        }
      }
      else {
        s_local = (char *)hash_17to32_bytes(s,length,seed);
      }
    }
    else {
      s_local = (char *)hash_9to16_bytes(s,length,seed);
    }
  }
  else {
    s_local = (char *)hash_4to8_bytes(s,length,seed);
  }
  return (uint64_t)s_local;
}

Assistant:

inline uint64_t hash_short(const char *s, size_t length, uint64_t seed) {
  if (length >= 4 && length <= 8)
    return hash_4to8_bytes(s, length, seed);
  if (length > 8 && length <= 16)
    return hash_9to16_bytes(s, length, seed);
  if (length > 16 && length <= 32)
    return hash_17to32_bytes(s, length, seed);
  if (length > 32)
    return hash_33to64_bytes(s, length, seed);
  if (length != 0)
    return hash_1to3_bytes(s, length, seed);

  return k2 ^ seed;
}